

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O1

void dg::pta::PointerAnalysisFSInv::replaceLocalsWithInv(PSNode *where,PointsToSetT *S1)

{
  ulong uVar1;
  PointerSubgraph *this;
  long lVar2;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *pvVar3;
  byte bVar4;
  long lVar5;
  PointsToSetT *__range2;
  const_iterator __begin2;
  PointsToSetT S;
  const_iterator local_98;
  PSNode *local_80;
  Pointer local_78;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_bucket_count = 1;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._4_4_ = 0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_98.container_it.
  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
       (S1->pointers)._bits.
       super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
       .
       super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       ._M_h._M_before_begin._M_nxt;
  local_98.container_end.
  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)(__node_type *)0x0
  ;
  local_98.pos = 0;
  if ((S1->pointers)._bits.
      super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
      .
      super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
      ._M_h._M_element_count != 0) {
    uVar1 = *(ulong *)((long)&(((__node_type *)
                               local_98.container_it.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                               ._M_cur)->
                              super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                              ._M_storage._M_storage + 8);
    if ((uVar1 & 1) == 0) {
      local_98.pos = 0;
      do {
        if (local_98.pos == 0x3f) {
          local_98.pos = 0x40;
          break;
        }
        bVar4 = (byte)local_98.pos;
        local_98.pos = local_98.pos + 1;
      } while ((uVar1 >> (bVar4 & 0x3f) & 2) == 0);
    }
    else {
      local_98.pos = 0;
    }
  }
  local_80 = where;
  if (local_98.pos != 0 ||
      local_98.container_it.
      super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur !=
      (__node_type *)0x0) {
    do {
      lVar2 = local_98.pos * 0x10 + _getConstant;
      lVar5 = (long)((_Hash_node_base *)
                    ((long)local_98.container_it.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                           ._M_cur + 8))->_M_nxt * 0x10;
      local_78.target = *(PSNode **)(lVar5 + -0x10 + lVar2);
      local_78.offset.offset = *(type *)(lVar5 + -8 + lVar2);
      if ((((((__node_type *)local_78.target != NULLPTR) &&
            ((__node_type *)local_78.target != UNKNOWN_MEMORY)) &&
           ((__node_type *)local_78.target != INVALIDATED._M_cur)) &&
          (((__node_type *)local_78.target != (__node_type *)0x0 &&
           (*(int *)&(((__node_type *)((long)local_78.target + 0x90))->super__Hash_node_base)._M_nxt
            == 1)))) &&
         ((((((__node_type *)((long)local_78.target + 0xd8))->
            super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>).
            super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>._M_storage.
            _M_storage.__data[9] != '\0' ||
           (((((__node_type *)((long)local_78.target + 0xd8))->
             super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>).
             super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>._M_storage.
             _M_storage.__data[10] != '\0' ||
            (*(long *)((long)&(((__node_type *)((long)local_78.target + 0x90))->
                              super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                              ._M_storage._M_storage + 8) != *(long *)(local_80 + 0xa0))))) ||
          ((this = *(PointerSubgraph **)
                    ((long)&(((__node_type *)((long)local_78.target + 0x90))->
                            super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                            ).
                            super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                            ._M_storage._M_storage + 8), this != (PointerSubgraph *)0x0 &&
           (pvVar3 = PointerSubgraph::getLoop(this,local_78.target),
           pvVar3 != (vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)0x0)))))) {
        PointerIdPointsToSet::add((PointerIdPointsToSet *)&local_68,&local_78);
      }
      ADT::
      SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
      ::const_iterator::operator++(&local_98);
    } while (local_98.container_it.
             super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
             != (__node_type *)0x0 || local_98.pos != 0);
  }
  local_98.container_it.
  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
       (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)INVALIDATED._M_cur
  ;
  local_98.container_end.
  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)(__node_type *)0x0
  ;
  PointerIdPointsToSet::add((PointerIdPointsToSet *)&local_68,(Pointer *)&local_98);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::swap((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          *)S1,&local_68);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

static void replaceLocalsWithInv(PSNode *where, PointsToSetT &S1) {
        PointsToSetT S;

        for (const auto &ptr : S1) {
            if (ptr.isNull() || ptr.isUnknown() || ptr.isInvalidated())
                continue;

            if (PSNodeAlloc *alloc = PSNodeAlloc::get(ptr.target)) {
                // if this is not local pointer or it is,
                // but we do not know which instance is being destroyed,
                // then keep the pointer
                if (!isLocal(alloc, where) || !knownInstance(alloc))
                    S.add(ptr);
            }
        }

        S.add(INVALIDATED, 0);
        S1.swap(S);
    }